

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O1

void child_reap(ev_loop *loop,int chain,int pid,int status)

{
  ev_watcher_list **ppeVar1;
  WL w [1];
  
  w[0] = childs[0];
  if (childs[0] != (WL)0x0) {
    do {
      if ((w[0][1].pending == chain || w[0][1].pending == 0) &&
         ((pid != 0xffff && (char)pid != '\x7f' || ((w[0][1].active & 1) != 0)))) {
        w[0]->priority = 2;
        w[0][1].priority = chain;
        *(int *)&w[0][1].field_0xc = pid;
        ev_feed_event(loop,w[0],0x800);
      }
      ppeVar1 = &w[0]->next;
      w[0] = *ppeVar1;
    } while (*ppeVar1 != (ev_watcher_list *)0x0);
  }
  return;
}

Assistant:

inline_speed void
child_reap (EV_P_ int chain, int pid, int status)
{
  ev_child *w;
  int traced = WIFSTOPPED (status) || WIFCONTINUED (status);

  for (w = (ev_child *)childs [chain & ((EV_PID_HASHSIZE) - 1)]; w; w = (ev_child *)((WL)w)->next)
    {
      if ((w->pid == pid || !w->pid)
          && (!traced || (w->flags & 1)))
        {
          ev_set_priority (w, EV_MAXPRI); /* need to do it *now*, this *must* be the same prio as the signal watcher itself */
          w->rpid    = pid;
          w->rstatus = status;
          ev_feed_event (EV_A_ (W)w, EV_CHILD);
        }
    }
}